

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

void __thiscall
QMainWindowLayoutState::setCentralWidget(QMainWindowLayoutState *this,QWidget *widget)

{
  QLayoutItem *pQVar1;
  QWidgetItemV2 *this_00;
  
  pQVar1 = (this->dockAreaLayout).centralWidgetItem;
  if (pQVar1 != (QLayoutItem *)0x0) {
    (*pQVar1->_vptr_QLayoutItem[1])();
  }
  (this->dockAreaLayout).centralWidgetItem = (QLayoutItem *)0x0;
  if (widget == (QWidget *)0x0) {
    this_00 = (QWidgetItemV2 *)0x0;
  }
  else {
    this_00 = (QWidgetItemV2 *)operator_new(0x58);
    QWidgetItemV2::QWidgetItemV2(this_00,widget);
  }
  (this->dockAreaLayout).centralWidgetItem = (QLayoutItem *)this_00;
  return;
}

Assistant:

void QMainWindowLayoutState::setCentralWidget(QWidget *widget)
{
    QLayoutItem *item = nullptr;
    //make sure we remove the widget
    deleteCentralWidgetItem();

    if (widget != nullptr)
        item = new QWidgetItemV2(widget);

#if QT_CONFIG(dockwidget)
    dockAreaLayout.centralWidgetItem = item;
#else
    centralWidgetItem = item;
#endif
}